

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O1

void read_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  sps_t *psVar1;
  slice_header_t *psVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  
  psVar1 = h->sps;
  psVar2 = h->sh;
  pbVar4 = b->p;
  pbVar3 = b->end;
  uVar11 = b->bits_left;
  uVar5 = 0xffffffff;
  iVar9 = 0;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar15 = true;
    if (pbVar4 < pbVar3) {
      bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar9 = iVar9 + -1;
  } while (((bool)(bVar15 & uVar5 < 0x20)) && (pbVar4 < pbVar3));
  if (iVar9 == -1) {
    uVar11 = 0;
  }
  else {
    iVar6 = -2 - iVar9;
    iVar12 = -3 - iVar9;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar11 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar3) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar11 = uVar11 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar12 != -2);
  }
  uVar5 = 0xffffffff;
  (psVar2->pwt).luma_log2_weight_denom = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar11;
  if (psVar1->ChromaArrayType != 0) {
    uVar11 = b->bits_left;
    pbVar4 = b->p;
    iVar9 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      bVar15 = true;
      if (pbVar4 < pbVar3) {
        bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
      }
      if (uVar11 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar9 = iVar9 + -1;
    } while (((bool)(bVar15 & uVar5 < 0x20)) && (pbVar4 < pbVar3));
    if (iVar9 == -1) {
      uVar11 = 0;
    }
    else {
      iVar6 = -2 - iVar9;
      iVar12 = -3 - iVar9;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar11 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < pbVar3) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar11 = uVar11 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar12 != -2);
    }
    (psVar2->pwt).chroma_log2_weight_denom = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar11;
  }
  if (-1 < psVar2->num_ref_idx_l0_active_minus1) {
    pbVar4 = b->p;
    lVar8 = 0;
    do {
      uVar5 = b->bits_left - 1;
      b->bits_left = uVar5;
      uVar11 = 0;
      if (pbVar4 < pbVar3) {
        uVar11 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
      }
      (psVar2->pwt).luma_weight_l0_flag[lVar8] = uVar11;
      if (uVar11 != 0) {
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar6 = iVar9;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar15 = true;
          if (pbVar4 < pbVar3) {
            bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
        if (uVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar10 = b->bits_left;
          uVar11 = 0;
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar13 = 0;
            if (pbVar4 < pbVar3) {
              uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar7 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar7 + uVar11;
        iVar9 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar9 = (int)(uVar11 - uVar7) >> 1;
        }
        (psVar2->pwt).luma_weight_l0[lVar8] = iVar9;
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar6 = iVar9;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar15 = true;
          if (pbVar4 < pbVar3) {
            bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
        if (uVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar10 = b->bits_left;
          uVar11 = 0;
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar13 = 0;
            if (pbVar4 < pbVar3) {
              uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar7 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar7 + uVar11;
        iVar9 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar9 = (int)(uVar11 - uVar7) >> 1;
        }
        (psVar2->pwt).luma_offset_l0[lVar8] = iVar9;
      }
      if (psVar1->ChromaArrayType != 0) {
        uVar5 = b->bits_left - 1;
        b->bits_left = uVar5;
        uVar11 = 0;
        if (pbVar4 < pbVar3) {
          uVar11 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
        }
        (psVar2->pwt).chroma_weight_l0_flag[lVar8] = uVar11;
        if (uVar11 != 0) {
          lVar14 = 0;
          do {
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar6 = iVar9;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar15 = true;
              if (pbVar4 < pbVar3) {
                bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar4 = pbVar4 + 1;
                b->p = pbVar4;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
            if (uVar5 == 0) {
              uVar11 = 0;
            }
            else {
              uVar10 = b->bits_left;
              uVar11 = 0;
              do {
                uVar10 = uVar10 - 1;
                b->bits_left = uVar10;
                uVar13 = 0;
                if (pbVar4 < pbVar3) {
                  uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
                }
                if (uVar10 == 0) {
                  pbVar4 = pbVar4 + 1;
                  b->p = pbVar4;
                  b->bits_left = 8;
                  uVar10 = 8;
                }
                uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar7 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar7 + uVar11;
            iVar9 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar9 = (int)(uVar11 - uVar7) >> 1;
            }
            (psVar2->pwt).chroma_weight_l0[lVar8][lVar14] = iVar9;
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar6 = iVar9;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar15 = true;
              if (pbVar4 < pbVar3) {
                bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar4 = pbVar4 + 1;
                b->p = pbVar4;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
            if (uVar5 == 0) {
              uVar11 = 0;
            }
            else {
              uVar10 = b->bits_left;
              uVar11 = 0;
              do {
                uVar10 = uVar10 - 1;
                b->bits_left = uVar10;
                uVar13 = 0;
                if (pbVar4 < pbVar3) {
                  uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
                }
                if (uVar10 == 0) {
                  pbVar4 = pbVar4 + 1;
                  b->p = pbVar4;
                  b->bits_left = 8;
                  uVar10 = 8;
                }
                uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar7 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar7 + uVar11;
            iVar9 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar9 = (int)(uVar11 - uVar7) >> 1;
            }
            (psVar2->pwt).chroma_offset_l0[lVar8][lVar14] = iVar9;
            bVar15 = lVar14 == 0;
            lVar14 = lVar14 + 1;
          } while (bVar15);
        }
      }
      bVar15 = lVar8 < psVar2->num_ref_idx_l0_active_minus1;
      lVar8 = lVar8 + 1;
    } while (bVar15);
  }
  iVar9 = psVar2->slice_type;
  iVar6 = iVar9 + -5;
  if (iVar9 < 5) {
    iVar6 = iVar9;
  }
  if ((iVar6 == 1) && (-1 < psVar2->num_ref_idx_l1_active_minus1)) {
    pbVar4 = b->p;
    pbVar3 = b->end;
    lVar8 = 0;
    do {
      uVar5 = b->bits_left - 1;
      b->bits_left = uVar5;
      uVar11 = 0;
      if (pbVar4 < pbVar3) {
        uVar11 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
      }
      (psVar2->pwt).luma_weight_l1_flag[lVar8] = uVar11;
      if (uVar11 != 0) {
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar6 = iVar9;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar15 = true;
          if (pbVar4 < pbVar3) {
            bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
        if (uVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar10 = b->bits_left;
          uVar11 = 0;
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar13 = 0;
            if (pbVar4 < pbVar3) {
              uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar7 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar7 + uVar11;
        iVar9 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar9 = (int)(uVar11 - uVar7) >> 1;
        }
        (psVar2->pwt).luma_weight_l1[lVar8] = iVar9;
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar6 = iVar9;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar15 = true;
          if (pbVar4 < pbVar3) {
            bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
        if (uVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar10 = b->bits_left;
          uVar11 = 0;
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar13 = 0;
            if (pbVar4 < pbVar3) {
              uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar7 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar7 + uVar11;
        iVar9 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar9 = (int)(uVar11 - uVar7) >> 1;
        }
        (psVar2->pwt).luma_offset_l1[lVar8] = iVar9;
      }
      if (psVar1->ChromaArrayType != 0) {
        uVar5 = b->bits_left - 1;
        b->bits_left = uVar5;
        uVar11 = 0;
        if (pbVar4 < pbVar3) {
          uVar11 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
        }
        (psVar2->pwt).chroma_weight_l1_flag[lVar8] = uVar11;
        if (uVar11 != 0) {
          lVar14 = 0;
          do {
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar6 = iVar9;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar15 = true;
              if (pbVar4 < pbVar3) {
                bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar4 = pbVar4 + 1;
                b->p = pbVar4;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
            if (uVar5 == 0) {
              uVar11 = 0;
            }
            else {
              uVar10 = b->bits_left;
              uVar11 = 0;
              do {
                uVar10 = uVar10 - 1;
                b->bits_left = uVar10;
                uVar13 = 0;
                if (pbVar4 < pbVar3) {
                  uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
                }
                if (uVar10 == 0) {
                  pbVar4 = pbVar4 + 1;
                  b->p = pbVar4;
                  b->bits_left = 8;
                  uVar10 = 8;
                }
                uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar7 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar7 + uVar11;
            iVar9 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar9 = (int)(uVar11 - uVar7) >> 1;
            }
            (psVar2->pwt).chroma_weight_l1[lVar8][lVar14] = iVar9;
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar6 = iVar9;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar15 = true;
              if (pbVar4 < pbVar3) {
                bVar15 = (*pbVar4 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar4 = pbVar4 + 1;
                b->p = pbVar4;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar9 = iVar6 + 1, pbVar4 < pbVar3));
            if (uVar5 == 0) {
              uVar11 = 0;
            }
            else {
              uVar10 = b->bits_left;
              uVar11 = 0;
              do {
                uVar10 = uVar10 - 1;
                b->bits_left = uVar10;
                uVar13 = 0;
                if (pbVar4 < pbVar3) {
                  uVar13 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
                }
                if (uVar10 == 0) {
                  pbVar4 = pbVar4 + 1;
                  b->p = pbVar4;
                  b->bits_left = 8;
                  uVar10 = 8;
                }
                uVar11 = uVar11 | uVar13 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar7 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar7 + uVar11;
            iVar9 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar9 = (int)(uVar11 - uVar7) >> 1;
            }
            (psVar2->pwt).chroma_offset_l1[lVar8][lVar14] = iVar9;
            bVar15 = lVar14 == 0;
            lVar14 = lVar14 + 1;
          } while (bVar15);
        }
      }
      bVar15 = lVar8 < psVar2->num_ref_idx_l1_active_minus1;
      lVar8 = lVar8 + 1;
    } while (bVar15);
  }
  return;
}

Assistant:

void read_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    sh->pwt.luma_log2_weight_denom = bs_read_ue(b);
    if( sps->ChromaArrayType != 0 )
    {
        sh->pwt.chroma_log2_weight_denom = bs_read_ue(b);
    }
    for( i = 0; i <= sh->num_ref_idx_l0_active_minus1; i++ )
    {
        sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b);
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            sh->pwt.luma_weight_l0[ i ] = bs_read_se(b);
            sh->pwt.luma_offset_l0[ i ] = bs_read_se(b);
        }
        if ( sps->ChromaArrayType != 0 )
        {
            sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b);
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b);
                    sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b);
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= sh->num_ref_idx_l1_active_minus1; i++ )
        {
            sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b);
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                sh->pwt.luma_weight_l1[ i ] = bs_read_se(b);
                sh->pwt.luma_offset_l1[ i ] = bs_read_se(b);
            }
            if( sps->ChromaArrayType != 0 )
            {
                sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b);
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b);
                        sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b);
                    }
                }
            }
        }
    }
}